

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O3

void __thiscall TSMuxer::buildPMT(TSMuxer *this)

{
  uint32_t uVar1;
  long lVar2;
  long lVar3;
  uint8_t *puVar4;
  uint8_t *__s;
  ulong __n;
  long lVar5;
  bool bVar6;
  
  this->m_pmtBuffer[0] = 'G';
  this->m_pmtBuffer[1] = 'A';
  this->m_pmtBuffer[2] = '\0';
  this->m_pmtBuffer[3] = '\x10';
  uVar1 = TS_program_map_section::serialize
                    (&this->m_pmt,this->m_pmtBuffer + 4,0xf18,this->m_bluRayMode,
                     this->m_hdmvDescriptors);
  __n = (ulong)uVar1;
  __s = this->m_pmtBuffer + __n + 4;
  if (this->m_pmtBuffer + 0xbc < __s) {
    puVar4 = this->m_pmtBuffer + 0x178;
    do {
      __n = __n - 0xb8;
      memmove(puVar4 + -0xb8,puVar4 + -0xbc,__n);
      __s = __s + 4;
      puVar4[-0xbc] = 'G';
      puVar4[-0xbb] = '\x01';
      puVar4[-0xba] = '\0';
      puVar4[-0xb9] = '\x10';
      bVar6 = puVar4 < __s;
      puVar4 = puVar4 + 0xbc;
    } while (bVar6);
  }
  lVar3 = (long)__s - (long)this->m_pmtBuffer;
  lVar2 = (lVar3 / 0xbc) * 0xbc;
  lVar5 = lVar2 + 0xbc;
  if (lVar3 == lVar2) {
    lVar5 = lVar3;
  }
  memset(__s,0xff,lVar5 - lVar3);
  this->m_pmtFrames = lVar5 / 0xbc;
  return;
}

Assistant:

void TSMuxer::buildPMT()
{
    *reinterpret_cast<uint32_t*>(m_pmtBuffer) = TSPacket::TS_FRAME_SYNC_BYTE + TSPacket::DATA_EXIST_BIT_VAL;
    const auto tsPacket = reinterpret_cast<TSPacket*>(m_pmtBuffer);
    tsPacket->setPID(DEFAULT_PMT_PID);
    tsPacket->dataExists = 1;
    tsPacket->payloadStart = 1;
    const uint32_t size =
        m_pmt.serialize(m_pmtBuffer + TSPacket::TS_HEADER_SIZE, 3864, m_bluRayMode, m_hdmvDescriptors);
    uint8_t* pmtEnd = m_pmtBuffer + TSPacket::TS_HEADER_SIZE + size;
    uint8_t* curPos = m_pmtBuffer + TS_FRAME_SIZE;
    for (; curPos < pmtEnd; curPos += TS_FRAME_SIZE)
    {
        memmove(curPos + 4, curPos, pmtEnd - curPos);
        pmtEnd += 4;
        *reinterpret_cast<uint32_t*>(curPos) = TSPacket::TS_FRAME_SYNC_BYTE + TSPacket::DATA_EXIST_BIT_VAL;
        const auto tsPacket2 = reinterpret_cast<TSPacket*>(curPos);
        tsPacket2->setPID(DEFAULT_PMT_PID);
        tsPacket2->dataExists = 1;
        tsPacket2->payloadStart = 0;
    }
    const int64_t oldPmtSize = pmtEnd - m_pmtBuffer;
    int64_t roundSize = pmtEnd - m_pmtBuffer;
    if (roundSize % TS_FRAME_SIZE != 0)
        roundSize = (roundSize / TS_FRAME_SIZE + 1) * TS_FRAME_SIZE;
    memset(pmtEnd, 0xff, roundSize - oldPmtSize);
    m_pmtFrames = roundSize / TS_FRAME_SIZE;
}